

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

void des3_cbc1_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  LR LVar9;
  byte *pbVar10;
  
  if (0 < len) {
    uVar7 = len + 8;
    pbVar10 = (byte *)((long)vdata + 7);
    do {
      uVar2 = (ulong)*pbVar10 << 0x20 | (ulong)pbVar10[-1] << 0x28 | (ulong)pbVar10[-2] << 0x30 |
              (ulong)pbVar10[-3] << 0x38;
      uVar1 = *(uint *)(pbVar10 + -7);
      uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = (uint)(uVar2 >> 0x20);
      uVar6 = (uVar4 >> 4 ^ uVar1) & 0xf0f0f0f;
      uVar8 = uVar6 << 4 ^ uVar4;
      uVar6 = uVar6 ^ uVar1;
      uVar5 = uVar6 & 0xffff ^ uVar8 >> 0x10;
      uVar8 = uVar5 << 0x10 ^ uVar8;
      uVar5 = uVar5 ^ uVar6;
      uVar6 = (uVar5 >> 2 ^ uVar8) & 0x33333333;
      uVar5 = uVar6 * 4 ^ uVar5;
      uVar6 = uVar6 ^ uVar8;
      uVar1 = (uVar5 >> 8 ^ uVar6) & 0xff00ff;
      uVar5 = uVar1 << 8 ^ uVar5;
      uVar1 = uVar1 ^ uVar6;
      uVar8 = (uVar1 >> 1 ^ uVar5) & 0x55555555;
      uVar1 = uVar8 * 2 ^ uVar1;
      uVar8 = uVar8 ^ uVar5;
      LVar9.L = uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f;
      LVar9.R = uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f;
      LVar9 = des_inner_cipher(LVar9,(des_keysched *)(ciph + -0x11),0xf,0xffffffffffffffff);
      LVar9 = des_inner_cipher(LVar9,(des_keysched *)(ciph + -0x21),0,1);
      LVar9 = des_inner_cipher(LVar9,(des_keysched *)(ciph + -0x31),0xf,0xffffffffffffffff);
      uVar1 = LVar9.L;
      uVar8 = LVar9.R << 1 | (uint)((long)LVar9 < 0);
      uVar5 = (uVar1 & 0x7fffffff ^ uVar8) & 0x55555555;
      uVar8 = uVar5 ^ uVar8;
      uVar5 = uVar5 * 2 ^ (uVar1 << 1 | (uint)((int)uVar1 < 0));
      uVar1 = (uVar8 >> 8 ^ uVar5) & 0xff00ff;
      uVar8 = uVar1 << 8 ^ uVar8;
      uVar1 = uVar1 ^ uVar5;
      uVar5 = (uVar8 >> 2 ^ uVar1) & 0x33333333;
      uVar8 = uVar5 * 4 ^ uVar8;
      uVar5 = uVar5 ^ uVar1;
      uVar1 = uVar8 & 0xffff ^ uVar5 >> 0x10;
      uVar5 = uVar1 << 0x10 ^ uVar5;
      uVar1 = uVar1 ^ uVar8;
      uVar8 = (uVar5 >> 4 ^ uVar1) & 0xf0f0f0f;
      uVar3 = CONCAT44(uVar8 ^ uVar1,uVar8 << 4 ^ uVar5) ^ (ulong)ciph[-1].vt;
      *(ushort *)(pbVar10 + -5) = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
      pbVar10[-6] = (byte)(uVar3 >> 0x10);
      pbVar10[-7] = (byte)(uVar3 >> 0x18);
      *pbVar10 = (byte)(uVar3 >> 0x20);
      pbVar10[-1] = (byte)(uVar3 >> 0x28);
      pbVar10[-2] = (byte)(uVar3 >> 0x30);
      pbVar10[-3] = (byte)(uVar3 >> 0x38);
      ciph[-1].vt = (ssh_cipheralg *)(uVar4 + uVar2);
      uVar7 = uVar7 - 8;
      pbVar10 = pbVar10 + 8;
    } while (8 < uVar7);
  }
  return;
}

Assistant:

static void des3_cbc1_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc1_ctx *ctx = container_of(ciph, struct des3_cbc1_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR ciphertext = des_load_lr(data);

        /* Similarly to encryption, but with the order reversed. */
        LR lr = des_IP(ciphertext);
        lr = des_inner_cipher(lr, &ctx->sched[2], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[0], DECIPHER);
        LR cipher_out = des_FP(lr);

        LR plaintext = des_xor_lr(cipher_out, ctx->iv);
        des_store_lr(data, plaintext);
        ctx->iv = ciphertext;
    }
}